

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QStringList * __thiscall
QCommandLineParser::optionNames(QStringList *__return_storage_ptr__,QCommandLineParser *this)

{
  QCommandLineParserPrivate::checkParsed(this->d,"optionNames");
  QArrayDataPointer<QString>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(this->d->optionNames).d);
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineParser::optionNames() const
{
    d->checkParsed("optionNames");
    return d->optionNames;
}